

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O2

string * __thiscall
cmsys::Encoding::ToNarrow_abi_cxx11_(string *__return_storage_ptr__,Encoding *this,wchar_t *wcstr)

{
  size_t sVar1;
  size_type __n;
  vector<char,_std::allocator<char>_> chars;
  allocator_type local_31;
  _Vector_base<char,_std::allocator<char>_> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = cmsysEncoding_wcstombs((char *)0x0,(wchar_t *)this,0);
  __n = sVar1 + 1;
  if (__n != 0) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_30,__n,&local_31);
    sVar1 = cmsysEncoding_wcstombs
                      (local_30._M_impl.super__Vector_impl_data._M_start,(wchar_t *)this,__n);
    if (sVar1 != 0) {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Encoding::ToNarrow(const wchar_t* wcstr)
{
  std::string str;
  size_t length = kwsysEncoding_wcstombs(0, wcstr, 0) + 1;
  if (length > 0) {
    std::vector<char> chars(length);
    if (kwsysEncoding_wcstombs(&chars[0], wcstr, length) > 0) {
      str = &chars[0];
    }
  }
  return str;
}